

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O3

void __thiscall HighsHashTable<MatrixRow,_int>::HighsHashTable(HighsHashTable<MatrixRow,_int> *this)

{
  pointer *__ptr;
  
  this->numElements = 0;
  (this->entries)._M_t.
  super___uniq_ptr_impl<HighsHashTableEntry<MatrixRow,_int>,_HighsHashTable<MatrixRow,_int>::OpNewDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_HighsHashTableEntry<MatrixRow,_int>_*,_HighsHashTable<MatrixRow,_int>::OpNewDeleter>
  .super__Head_base<0UL,_HighsHashTableEntry<MatrixRow,_int>_*,_false>._M_head_impl =
       (HighsHashTableEntry<MatrixRow,_int> *)0x0;
  (this->metadata)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  makeEmptyTable(this,0x80);
  return;
}

Assistant:

HighsHashTable() { makeEmptyTable(128); }